

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HSimplexNlaDebug.cpp
# Opt level: O1

HighsDebugStatus __thiscall
HSimplexNla::debugReportInvertSolutionError
          (HSimplexNla *this,bool transposed,HVector *true_solution,HVector *solution,
          HVector *residual,bool force)

{
  HighsDebugStatus HVar1;
  long lVar2;
  long lVar3;
  double dVar4;
  double solve_error_norm;
  string local_48;
  
  lVar2 = (long)this->lp_->num_row_;
  if (lVar2 < 1) {
    solve_error_norm = 0.0;
  }
  else {
    solve_error_norm = 0.0;
    lVar3 = 0;
    do {
      dVar4 = ABS((solution->array).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar3] -
                  (true_solution->array).super__Vector_base<double,_std::allocator<double>_>._M_impl
                  .super__Vector_impl_data._M_start[lVar3]);
      if (solve_error_norm <= dVar4) {
        solve_error_norm = dVar4;
      }
      lVar3 = lVar3 + 1;
    } while (lVar2 != lVar3);
  }
  dVar4 = debugInvertResidualError(this,transposed,solution,residual);
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"random solution","");
  HVar1 = debugReportInvertSolutionError(this,&local_48,transposed,solve_error_norm,dVar4,force);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  return HVar1;
}

Assistant:

HighsDebugStatus HSimplexNla::debugReportInvertSolutionError(
    const bool transposed, const HVector& true_solution,
    const HVector& solution, HVector& residual, const bool force) const {
  const HighsInt num_row = this->lp_->num_row_;
  double solve_error_norm = 0;
  for (HighsInt iRow = 0; iRow < num_row; iRow++) {
    double solve_error = fabs(solution.array[iRow] - true_solution.array[iRow]);
    solve_error_norm = std::max(solve_error, solve_error_norm);
  }
  double residual_error_norm =
      debugInvertResidualError(transposed, solution, residual);

  return debugReportInvertSolutionError("random solution", transposed,
                                        solve_error_norm, residual_error_norm,
                                        force);
}